

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::WireFormat::MessageSetItemByteSize
                 (FieldDescriptor *field,Message *message)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long *plVar3;
  long lVar4;
  uint uVar5;
  
  iVar2 = (*(message->super_MessageLite)._vptr_MessageLite[0x16])(message);
  iVar1 = 0x1f;
  if ((*(uint *)(field + 0x38) | 1) != 0) {
    for (; (*(uint *)(field + 0x38) | 1) >> iVar1 == 0; iVar1 = iVar1 + -1) {
    }
  }
  plVar3 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0xd8))
                             ((long *)CONCAT44(extraout_var,iVar2),message,field,0);
  lVar4 = (**(code **)(*plVar3 + 0x60))(plVar3);
  uVar5 = (uint)lVar4 | 1;
  iVar2 = 0x1f;
  if (uVar5 != 0) {
    for (; uVar5 >> iVar2 == 0; iVar2 = iVar2 + -1) {
    }
  }
  return lVar4 + 4 + (ulong)(iVar1 * 9 + 0x49U >> 6) + (ulong)(iVar2 * 9 + 0x49U >> 6);
}

Assistant:

size_t WireFormat::MessageSetItemByteSize(
    const FieldDescriptor* field,
    const Message& message) {
  const Reflection* message_reflection = message.GetReflection();

  size_t our_size = WireFormatLite::kMessageSetItemTagsSize;

  // type_id
  our_size += io::CodedOutputStream::VarintSize32(field->number());

  // message
  const Message& sub_message = message_reflection->GetMessage(message, field);
  size_t message_size = sub_message.ByteSizeLong();

  our_size += io::CodedOutputStream::VarintSize32(message_size);
  our_size += message_size;

  return our_size;
}